

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WindowRewrite(Parse *pParse,Select *p)

{
  Window *pWin_00;
  Select *pParse_00;
  int iVar1;
  Expr *pEVar2;
  SrcList *pSVar3;
  int local_88;
  int local_84;
  Expr *pFilter;
  Window *pWin;
  Window *pMWin;
  ExprList *pSublist;
  ExprList *pSort;
  Expr *pHaving;
  ExprList *pGroupBy;
  Expr *pWhere;
  SrcList *pSrc;
  Select *pSub;
  sqlite3 *db;
  Vdbe *v;
  Select *pSStack_18;
  int rc;
  Select *p_local;
  Parse *pParse_local;
  
  v._4_4_ = 0;
  if ((p->pWin != (Window *)0x0) && (p->pPrior == (Select *)0x0)) {
    pSStack_18 = p;
    p_local = (Select *)pParse;
    db = (sqlite3 *)sqlite3GetVdbe(pParse);
    pSub = (Select *)p_local->pEList;
    pSrc = (SrcList *)0x0;
    pWhere = (Expr *)pSStack_18->pSrc;
    pGroupBy = (ExprList *)pSStack_18->pWhere;
    pHaving = (Expr *)pSStack_18->pGroupBy;
    pSort = (ExprList *)pSStack_18->pHaving;
    pSublist = (ExprList *)0x0;
    pMWin = (Window *)0x0;
    pWin_00 = pSStack_18->pWin;
    pSStack_18->pSrc = (SrcList *)0x0;
    pSStack_18->pWhere = (Expr *)0x0;
    pSStack_18->pGroupBy = (ExprList *)0x0;
    pSStack_18->pHaving = (Expr *)0x0;
    pSublist = sqlite3ExprListDup((sqlite3 *)pSub,pWin_00->pPartition,0);
    pSublist = exprListAppendList((Parse *)p_local,pSublist,pWin_00->pOrderBy);
    if ((pSublist != (ExprList *)0x0) &&
       ((pSStack_18->pOrderBy != (ExprList *)0x0 &&
        (iVar1 = sqlite3ExprListCompare(pSublist,pSStack_18->pOrderBy,-1), iVar1 == 0)))) {
      sqlite3ExprListDelete((sqlite3 *)pSub,pSStack_18->pOrderBy);
      pSStack_18->pOrderBy = (ExprList *)0x0;
    }
    iVar1 = *(int *)((long)&p_local->pWhere + 4);
    *(int *)((long)&p_local->pWhere + 4) = iVar1 + 1;
    pWin_00->iEphCsr = iVar1;
    *(int *)((long)&p_local->pWhere + 4) = *(int *)((long)&p_local->pWhere + 4) + 3;
    selectWindowRewriteEList
              ((Parse *)p_local,pWin_00,(SrcList *)pWhere,pSStack_18->pEList,(ExprList **)&pMWin);
    selectWindowRewriteEList
              ((Parse *)p_local,pWin_00,(SrcList *)pWhere,pSStack_18->pOrderBy,(ExprList **)&pMWin);
    if (pMWin == (Window *)0x0) {
      local_84 = 0;
    }
    else {
      local_84 = *(int *)&pMWin->zName;
    }
    pWin_00->nBufferCol = local_84;
    pMWin = (Window *)exprListAppendList((Parse *)p_local,(ExprList *)pMWin,pWin_00->pPartition);
    pMWin = (Window *)exprListAppendList((Parse *)p_local,(ExprList *)pMWin,pWin_00->pOrderBy);
    for (pFilter = (Expr *)pWin_00; pParse_00 = p_local, pFilter != (Expr *)0x0;
        pFilter = (Expr *)pFilter->pAggInfo) {
      if (pMWin == (Window *)0x0) {
        local_88 = 0;
      }
      else {
        local_88 = *(int *)&pMWin->zName;
      }
      pFilter[1].iTable = local_88;
      pMWin = (Window *)
              exprListAppendList((Parse *)p_local,(ExprList *)pMWin,
                                 *(ExprList **)&(pFilter[1].x.pList)->a[0].sortOrder);
      if ((pFilter->y).pTab != (Table *)0x0) {
        pEVar2 = sqlite3ExprDup((sqlite3 *)pSub,(Expr *)(pFilter->y).pTab,0);
        pMWin = (Window *)sqlite3ExprListAppend((Parse *)p_local,(ExprList *)pMWin,pEVar2);
      }
      iVar1 = *(int *)&p_local->pGroupBy + 1;
      *(int *)&p_local->pGroupBy = iVar1;
      *(int *)((long)&pFilter[1].u + 4) = iVar1;
      iVar1 = *(int *)&p_local->pGroupBy + 1;
      *(int *)&p_local->pGroupBy = iVar1;
      *(int *)&pFilter[1].pLeft = iVar1;
      sqlite3VdbeAddOp2((Vdbe *)db,0x49,0,*(int *)((long)&pFilter[1].u + 4));
    }
    if (pMWin == (Window *)0x0) {
      pEVar2 = sqlite3ExprAlloc((sqlite3 *)pSub,0x93,sqlite3IntTokens,0);
      pMWin = (Window *)sqlite3ExprListAppend((Parse *)pParse_00,(ExprList *)0x0,pEVar2);
    }
    pSrc = (SrcList *)
           sqlite3SelectNew((Parse *)p_local,(ExprList *)pMWin,(SrcList *)pWhere,(Expr *)pGroupBy,
                            (ExprList *)pHaving,(Expr *)pSort,pSublist,0,(Expr *)0x0);
    pSVar3 = sqlite3SrcListAppend((Parse *)p_local,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
    pSStack_18->pSrc = pSVar3;
    if (pSStack_18->pSrc == (SrcList *)0x0) {
      sqlite3SelectDelete((sqlite3 *)pSub,(Select *)pSrc);
    }
    else {
      pSStack_18->pSrc->a[0].pSelect = (Select *)pSrc;
      sqlite3SrcListAssignCursors((Parse *)p_local,pSStack_18->pSrc);
      iVar1 = sqlite3ExpandSubquery((Parse *)p_local,pSStack_18->pSrc->a);
      if (iVar1 == 0) {
        *(uint *)((long)&pSrc->a[0].pSchema + 4) = *(uint *)((long)&pSrc->a[0].pSchema + 4) | 0x40;
        pSStack_18->selFlags = pSStack_18->selFlags & 0xfffffff7;
        sqlite3SelectPrep((Parse *)p_local,(Select *)pSrc,(NameContext *)0x0);
      }
      else {
        v._4_4_ = 7;
      }
      sqlite3VdbeAddOp2((Vdbe *)db,0x71,pWin_00->iEphCsr,*(int *)&pMWin->zName);
      sqlite3VdbeAddOp2((Vdbe *)db,0x6f,pWin_00->iEphCsr + 1,pWin_00->iEphCsr);
      sqlite3VdbeAddOp2((Vdbe *)db,0x6f,pWin_00->iEphCsr + 2,pWin_00->iEphCsr);
      sqlite3VdbeAddOp2((Vdbe *)db,0x6f,pWin_00->iEphCsr + 3,pWin_00->iEphCsr);
    }
    if (*(char *)((long)&pSub->pLimit + 1) != '\0') {
      v._4_4_ = 7;
    }
  }
  return v._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3WindowRewrite(Parse *pParse, Select *p){
  int rc = SQLITE_OK;
  if( p->pWin && p->pPrior==0 ){
    Vdbe *v = sqlite3GetVdbe(pParse);
    sqlite3 *db = pParse->db;
    Select *pSub = 0;             /* The subquery */
    SrcList *pSrc = p->pSrc;
    Expr *pWhere = p->pWhere;
    ExprList *pGroupBy = p->pGroupBy;
    Expr *pHaving = p->pHaving;
    ExprList *pSort = 0;

    ExprList *pSublist = 0;       /* Expression list for sub-query */
    Window *pMWin = p->pWin;      /* Master window object */
    Window *pWin;                 /* Window object iterator */

    p->pSrc = 0;
    p->pWhere = 0;
    p->pGroupBy = 0;
    p->pHaving = 0;

    /* Create the ORDER BY clause for the sub-select. This is the concatenation
    ** of the window PARTITION and ORDER BY clauses. Then, if this makes it
    ** redundant, remove the ORDER BY from the parent SELECT.  */
    pSort = sqlite3ExprListDup(db, pMWin->pPartition, 0);
    pSort = exprListAppendList(pParse, pSort, pMWin->pOrderBy);
    if( pSort && p->pOrderBy ){
      if( sqlite3ExprListCompare(pSort, p->pOrderBy, -1)==0 ){
        sqlite3ExprListDelete(db, p->pOrderBy);
        p->pOrderBy = 0;
      }
    }

    /* Assign a cursor number for the ephemeral table used to buffer rows.
    ** The OpenEphemeral instruction is coded later, after it is known how
    ** many columns the table will have.  */
    pMWin->iEphCsr = pParse->nTab++;
    pParse->nTab += 3;

    selectWindowRewriteEList(pParse, pMWin, pSrc, p->pEList, &pSublist);
    selectWindowRewriteEList(pParse, pMWin, pSrc, p->pOrderBy, &pSublist);
    pMWin->nBufferCol = (pSublist ? pSublist->nExpr : 0);

    /* Append the PARTITION BY and ORDER BY expressions to the to the 
    ** sub-select expression list. They are required to figure out where 
    ** boundaries for partitions and sets of peer rows lie.  */
    pSublist = exprListAppendList(pParse, pSublist, pMWin->pPartition);
    pSublist = exprListAppendList(pParse, pSublist, pMWin->pOrderBy);

    /* Append the arguments passed to each window function to the
    ** sub-select expression list. Also allocate two registers for each
    ** window function - one for the accumulator, another for interim
    ** results.  */
    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      pWin->iArgCol = (pSublist ? pSublist->nExpr : 0);
      pSublist = exprListAppendList(pParse, pSublist, pWin->pOwner->x.pList);
      if( pWin->pFilter ){
        Expr *pFilter = sqlite3ExprDup(db, pWin->pFilter, 0);
        pSublist = sqlite3ExprListAppend(pParse, pSublist, pFilter);
      }
      pWin->regAccum = ++pParse->nMem;
      pWin->regResult = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
    }

    /* If there is no ORDER BY or PARTITION BY clause, and the window
    ** function accepts zero arguments, and there are no other columns
    ** selected (e.g. "SELECT row_number() OVER () FROM t1"), it is possible
    ** that pSublist is still NULL here. Add a constant expression here to 
    ** keep everything legal in this case. 
    */
    if( pSublist==0 ){
      pSublist = sqlite3ExprListAppend(pParse, 0, 
          sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[0], 0)
      );
    }

    pSub = sqlite3SelectNew(
        pParse, pSublist, pSrc, pWhere, pGroupBy, pHaving, pSort, 0, 0
    );
    p->pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
    if( p->pSrc ){
      p->pSrc->a[0].pSelect = pSub;
      sqlite3SrcListAssignCursors(pParse, p->pSrc);
      if( sqlite3ExpandSubquery(pParse, &p->pSrc->a[0]) ){
        rc = SQLITE_NOMEM;
      }else{
        pSub->selFlags |= SF_Expanded;
        p->selFlags &= ~SF_Aggregate;
        sqlite3SelectPrep(pParse, pSub, 0);
      }

      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pMWin->iEphCsr, pSublist->nExpr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+1, pMWin->iEphCsr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+2, pMWin->iEphCsr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+3, pMWin->iEphCsr);
    }else{
      sqlite3SelectDelete(db, pSub);
    }
    if( db->mallocFailed ) rc = SQLITE_NOMEM;
  }

  return rc;
}